

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QSize __thiscall QDockWidgetGroupLayout::minimumSize(QDockWidgetGroupLayout *this)

{
  int iVar1;
  QSize QVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *unaff_retaddr;
  int fw;
  QSize *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = frameWidth((QDockWidgetGroupLayout *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  local_10 = QDockAreaLayoutInfo::minimumSize(unaff_retaddr);
  QSize::QSize(&local_18,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  QVar2 = ::operator+((QSize *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize minimumSize() const override
    {
        int fw = frameWidth();
        return layoutState.minimumSize() + QSize(fw, fw);
    }